

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O1

void __thiscall cfd::core::SchnorrPubkey::SchnorrPubkey(SchnorrPubkey *this,ByteData *data)

{
  pointer puVar1;
  bool bVar2;
  size_t sVar3;
  CfdException *pCVar4;
  SchnorrPubkey pk;
  string local_78;
  ByteData local_58;
  Pubkey local_40;
  
  ByteData256::ByteData256(&this->data_);
  bVar2 = Pubkey::IsValid(data);
  if (bVar2) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,&data->data_);
    Pubkey::Pubkey(&local_40,&local_58);
    FromPubkey((SchnorrPubkey *)&local_78,&local_40,(bool *)0x0);
    if (local_40.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
    if ((pointer)local_78._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  else {
    sVar3 = ByteData::GetDataSize(data);
    if (sVar3 != 0x20) {
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Invalid Schnorr pubkey length.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_78);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData256::ByteData256((ByteData256 *)&local_78,data);
    puVar1 = (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_78._M_dataplus._M_p;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_78._M_string_length;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_78.field_2._M_allocated_capacity;
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity = 0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    if (local_78._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    bVar2 = ByteData256::IsEmpty(&this->data_);
    if (bVar2) {
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Invalid Schnorr pubkey data.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_78);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  return;
}

Assistant:

SchnorrPubkey::SchnorrPubkey(const ByteData &data) : data_() {
  if (Pubkey::IsValid(data)) {
    auto pk = SchnorrPubkey::FromPubkey(Pubkey(data));
    data_ = pk.data_;
  } else {
    if (data.GetDataSize() != SchnorrPubkey::kSchnorrPubkeySize) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid Schnorr pubkey length.");
    }
    data_ = ByteData256(data);
    if (data_.IsEmpty()) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Invalid Schnorr pubkey data.");
    }
  }
}